

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlNodeGetLang(xmlNode *cur)

{
  int iVar1;
  xmlChar *pxStack_20;
  int res;
  xmlChar *lang;
  xmlNode *cur_local;
  
  if ((cur != (xmlNode *)0x0) && (lang = (xmlChar *)cur, cur->type != XML_NAMESPACE_DECL)) {
    for (; lang != (xmlChar *)0x0; lang = *(xmlChar **)(lang + 0x28)) {
      iVar1 = xmlNodeGetAttrValue((xmlNode *)lang,"lang",
                                  (xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                  &stack0xffffffffffffffe0);
      if (iVar1 < 0) {
        return (xmlChar *)0x0;
      }
      if (pxStack_20 != (xmlChar *)0x0) {
        return pxStack_20;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNodeGetLang(const xmlNode *cur) {
    xmlChar *lang;
    int res;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
        return(NULL);

    while (cur != NULL) {
        res = xmlNodeGetAttrValue(cur, BAD_CAST "lang", XML_XML_NAMESPACE,
                                  &lang);
        if (res < 0)
            return(NULL);
	if (lang != NULL)
	    return(lang);

	cur = cur->parent;
    }

    return(NULL);
}